

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::DrawFullScreenStuff(DStrifeStatusBar *this)

{
  FImageCollection *this_00;
  FTextureID texnum;
  player_t *ppVar1;
  DFrameBuffer *pDVar2;
  undefined4 uVar3;
  FTexture *pFVar4;
  ABasicArmor *pAVar5;
  AInventory *pAVar6;
  AInventory *pAVar7;
  int iVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  AAmmo *ammo2;
  AAmmo *ammo1;
  DStrifeStatusBar *local_48;
  DFrameBuffer *local_40;
  int ammocount2;
  int ammocount1;
  
  DBaseStatusBar::DrINumberOuter
            (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->health,4,-10,false,
             7);
  pDVar2 = screen;
  this_00 = &this->Images;
  pFVar4 = FImageCollection::operator[](this_00,0x1f);
  DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar4,14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  pAVar5 = AActor::FindInventory<ABasicArmor>
                     (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
  if ((pAVar5 != (ABasicArmor *)0x0) &&
     (iVar8 = (pAVar5->super_AArmor).super_AInventory.Amount, iVar8 != 0)) {
    DBaseStatusBar::DrINumberOuter(&this->super_DBaseStatusBar,iVar8,0x23,-10,false,7);
    pDVar2 = screen;
    pFVar4 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(pAVar5->super_AArmor).super_AInventory.Icon.texnum,
                        false);
    DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar4,45.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  }
  DBaseStatusBar::GetCurrentAmmo(&this->super_DBaseStatusBar,&ammo1,&ammo2,&ammocount1,&ammocount2);
  if (ammo1 != (AAmmo *)0x0) {
    DBaseStatusBar::DrINumberOuter
              (&this->super_DBaseStatusBar,(ammo1->super_AInventory).Amount,-0x17,-10,false,7);
    pDVar2 = screen;
    pFVar4 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(ammo1->super_AInventory).Icon.texnum,false);
    DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar4,-14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
    if ((ammo2 != (AAmmo *)0x0) && (ammo1 != ammo2)) {
      DBaseStatusBar::DrINumberOuter
                (&this->super_DBaseStatusBar,(ammo2->super_AInventory).Amount,-0x17,-0x30,false,7);
      pDVar2 = screen;
      pFVar4 = FTextureManager::operator()
                         (&TexMan,(FTextureID)(ammo2->super_AInventory).Icon.texnum,false);
      DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar4,-14.0,-55.0,0x400013a6,0,0x4000139e,1,0);
    }
  }
  if (deathmatch.Value != 0) {
    DBaseStatusBar::DrBNumberOuterFont
              (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->fragcount,-0x2c,1
               ,3);
  }
  ppVar1 = (this->super_DBaseStatusBar).CPlayer;
  if (ppVar1->inventorytics == 0) {
    pAVar6 = GC::ReadBarrier<AInventory>((AInventory **)&ppVar1->mo->InvSel);
    if (pAVar6 != (AInventory *)0x0) {
      if (0.0 < this->ItemFlash) {
        pFVar4 = FImageCollection::operator[](this_00,this->CursorImage);
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar4,-28.0,-15.0,0x400013a6,this->ItemFlash,0,0x4000139c,
                   (ulong)pFVar4->Width,0x4000139b,(uint)pFVar4->Height,0x4000138c,0);
      }
      pAVar6 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      DBaseStatusBar::DrINumberOuter(&this->super_DBaseStatusBar,pAVar6->Amount,-0x33,-10,false,7);
      pDVar2 = screen;
      pAVar6 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      pFVar4 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar6->Icon).texnum,false);
      pAVar6 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      uVar3 = 0xaa000000;
      if (0 < pAVar6->Amount) {
        uVar3 = 0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)pDVar2,pFVar4,-42.0,-17.0,0x400013a6,0,0x4000139e,1,0x400013aa,uVar3,0);
    }
  }
  else {
    pAVar6 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
    (((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar6;
    pAVar6 = GC::ReadBarrier<AInventory>
                       ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
    if (pAVar6 != (AInventory *)0x0) {
      pAVar6 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
      iVar8 = 0;
      local_48 = this;
      for (uVar10 = 0; (pAVar6 != (AInventory *)0x0 && (uVar10 < 6)); uVar10 = uVar10 + 1) {
        pAVar7 = GC::ReadBarrier<AInventory>
                           ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
        pDVar2 = screen;
        if (pAVar6 == pAVar7) {
          pFVar4 = FImageCollection::operator[](this_00,this->CursorImage);
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar2,pFVar4,(double)(iVar8 + -100),-21.0,0x400013a6,1,0x4000138b,
                     0xc000,0);
        }
        texnum.texnum = (pAVar6->Icon).texnum;
        iVar11 = iVar8;
        if (0 < texnum.texnum) {
          local_40 = screen;
          uVar9 = 0;
          pFVar4 = FTextureManager::operator()(&TexMan,texnum,false);
          pAVar7 = GC::ReadBarrier<AInventory>
                             ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
          if (pAVar7->Amount < 1) {
            uVar9 = 0xaa000000;
          }
          iVar11 = uVar10 * 0x23;
          DCanvas::DrawTexture
                    ((DCanvas *)local_40,pFVar4,(double)(iVar8 + -0x5e),-19.0,0x400013a6,1,
                     0x400013aa,uVar9,0);
          this = local_48;
        }
        DBaseStatusBar::DrINumberOuter
                  (&this->super_DBaseStatusBar,pAVar6->Amount,iVar11 + -0x59,-10,true,7);
        pAVar6 = AInventory::NextInv(pAVar6);
        iVar8 = iVar8 + 0x23;
      }
    }
  }
  return;
}

Assistant:

void DrawFullScreenStuff ()
	{
		// Draw health
		DrINumberOuter (CPlayer->health, 4, -10, false, 7);
		screen->DrawTexture (Images[imgMEDI], 14, -17,
			DTA_HUDRules, HUD_Normal,
			DTA_CenterBottomOffset, true,
			TAG_DONE);

		// Draw armor
		ABasicArmor *armor = CPlayer->mo->FindInventory<ABasicArmor>();
		if (armor != NULL && armor->Amount != 0)
		{
			DrINumberOuter (armor->Amount, 35, -10, false, 7);
			screen->DrawTexture (TexMan(armor->Icon), 45, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
		}

		// Draw ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			// Draw primary ammo in the bottom-right corner
			DrINumberOuter (ammo1->Amount, -23, -10, false, 7);
			screen->DrawTexture (TexMan(ammo1->Icon), -14, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
			if (ammo2 != NULL && ammo1!=ammo2)
			{
				// Draw secondary ammo just above the primary ammo
				DrINumberOuter (ammo2->Amount, -23, -48, false, 7);
				screen->DrawTexture (TexMan(ammo2->Icon), -14, -55,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
			}
		}

		if (deathmatch)
		{ // Draw frags (in DM)
			DrBNumberOuterFont (CPlayer->fragcount, -44, 1);
		}

		// Draw inventory
		if (CPlayer->inventorytics == 0)
		{
			if (CPlayer->mo->InvSel != 0)
			{
				if (ItemFlash > 0)
				{
					FTexture *cursor = Images[CursorImage];
					screen->DrawTexture (cursor, -28, -15,
						DTA_HUDRules, HUD_Normal,
						DTA_LeftOffset, cursor->GetWidth(),
						DTA_TopOffset, cursor->GetHeight(),
						DTA_AlphaF, ItemFlash,
						TAG_DONE);
				}
				DrINumberOuter (CPlayer->mo->InvSel->Amount, -51, -10, false, 7);
				screen->DrawTexture (TexMan(CPlayer->mo->InvSel->Icon), -42, -17,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
					TAG_DONE);
			}
		}
		else
		{
			CPlayer->mo->InvFirst = ValidateInvFirst (6);
			int i = 0;
			AInventory *item;
			if (CPlayer->mo->InvFirst != NULL)
			{
				for (item = CPlayer->mo->InvFirst; item != NULL && i < 6; item = item->NextInv(), ++i)
				{
					if (item == CPlayer->mo->InvSel)
					{
						screen->DrawTexture (Images[CursorImage], -100+i*35, -21,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_Alpha, TRANSLUC75,
							TAG_DONE);
					}
					if (item->Icon.isValid())
					{
						screen->DrawTexture (TexMan(item->Icon), -94 + i*35, -19,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
							TAG_DONE);
					}
					DrINumberOuter (item->Amount, -89 + i*35, -10, true, 7);
				}
			}
		}
	}